

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O3

char * __thiscall
cmCommandArgumentParserHelper::ExpandVariable(cmCommandArgumentParserHelper *this,char *var)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  _Alloc_hider _Var8;
  ostringstream ostr;
  allocator local_20c;
  allocator local_20b;
  allocator local_20a;
  allocator local_209;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  if (var == (char *)0x0) {
    return (char *)0x0;
  }
  if ((-1 < this->FileLine) && (iVar5 = strcmp(var,"CMAKE_CURRENT_LIST_LINE"), iVar5 == 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::_M_insert<long>((long)local_1a8);
    std::__cxx11::stringbuf::str();
    pcVar7 = AddString(this,&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    return pcVar7;
  }
  pcVar2 = this->Makefile;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_1a8 + 0x10);
  local_1a8._0_8_ = paVar1;
  sVar6 = strlen(var);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,var,var + sVar6);
  pcVar7 = cmMakefile::GetDefinition(pcVar2,(string *)local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != paVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (pcVar7 == (char *)0x0) {
    if (this->RemoveEmpty == false) {
      if (this->WarnUninitialized == true) {
        pcVar2 = this->Makefile;
        local_1a8._0_8_ = paVar1;
        sVar6 = strlen(var);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,var,var + sVar6);
        bVar3 = cmMakefile::VariableInitialized(pcVar2,(string *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._0_8_ != paVar1) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if (!bVar3) {
          if (this->CheckSystemVars == false) {
            std::__cxx11::string::string((string *)local_1a8,this->FileName,&local_209);
            pcVar7 = cmMakefile::GetHomeDirectory(this->Makefile);
            std::__cxx11::string::string((string *)&local_208,pcVar7,&local_20a);
            bVar3 = cmsys::SystemTools::IsSubDirectory((string *)local_1a8,&local_208);
            bVar4 = true;
            if (!bVar3) {
              std::__cxx11::string::string((string *)&local_1c8,this->FileName,&local_20b);
              pcVar7 = cmMakefile::GetHomeOutputDirectory(this->Makefile);
              std::__cxx11::string::string((string *)&local_1e8,pcVar7,&local_20c);
              bVar4 = cmsys::SystemTools::IsSubDirectory(&local_1c8,&local_1e8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                operator_delete(local_1e8._M_dataplus._M_p,
                                local_1e8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                operator_delete(local_1c8._M_dataplus._M_p,
                                local_1c8.field_2._M_allocated_capacity + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) {
              operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._0_8_ != paVar1) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            if (bVar4 == false) {
              return (char *)0x0;
            }
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"uninitialized variable \'",0x18);
          sVar6 = strlen(var);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,var,sVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\'",1);
          pcVar2 = this->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,&local_208);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
      }
      return (char *)0x0;
    }
    pcVar7 = "";
  }
  else if (this->EscapeQuotes == true) {
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    sVar6 = strlen(pcVar7);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,pcVar7,pcVar7 + sVar6);
    cmSystemTools::EscapeQuotes((string *)local_1a8,&local_208);
    pcVar7 = AddString(this,(string *)local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ != paVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    local_1a8._16_8_ = local_208.field_2._M_allocated_capacity;
    _Var8._M_p = local_208._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p == &local_208.field_2) {
      return pcVar7;
    }
    goto LAB_0034f311;
  }
  local_1a8._0_8_ = paVar1;
  sVar6 = strlen(pcVar7);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar7,pcVar7 + sVar6);
  pcVar7 = AddString(this,(string *)local_1a8);
  _Var8._M_p = (pointer)local_1a8._0_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ == paVar1) {
    return pcVar7;
  }
LAB_0034f311:
  operator_delete(_Var8._M_p,local_1a8._16_8_ + 1);
  return pcVar7;
}

Assistant:

char* cmCommandArgumentParserHelper::ExpandVariable(const char* var)
{
  if (!var) {
    return CM_NULLPTR;
  }
  if (this->FileLine >= 0 && strcmp(var, "CMAKE_CURRENT_LIST_LINE") == 0) {
    std::ostringstream ostr;
    ostr << this->FileLine;
    return this->AddString(ostr.str());
  }
  const char* value = this->Makefile->GetDefinition(var);
  if (!value && !this->RemoveEmpty) {
    // check to see if we need to print a warning
    // if strict mode is on and the variable has
    // not been "cleared"/initialized with a set(foo ) call
    if (this->WarnUninitialized && !this->Makefile->VariableInitialized(var)) {
      if (this->CheckSystemVars ||
          cmSystemTools::IsSubDirectory(this->FileName,
                                        this->Makefile->GetHomeDirectory()) ||
          cmSystemTools::IsSubDirectory(
            this->FileName, this->Makefile->GetHomeOutputDirectory())) {
        std::ostringstream msg;
        msg << "uninitialized variable \'" << var << "\'";
        this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, msg.str());
      }
    }
    return CM_NULLPTR;
  }
  if (this->EscapeQuotes && value) {
    return this->AddString(cmSystemTools::EscapeQuotes(value));
  }
  return this->AddString(value ? value : "");
}